

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BerdyHelper.cpp
# Opt level: O0

bool __thiscall
iDynTree::BerdyHelper::serializeSensorVariables
          (BerdyHelper *this,SensorsMeasurements *sensMeas,LinkNetExternalWrenches *netExtWrenches,
          JointDOFsDoubleArray *jointTorques,JointDOFsDoubleArray *jointAccs,
          LinkInternalWrenches *linkJointWrenches,SpatialForceVector *rcm,VectorDynSize *y)

{
  IndexRange range;
  IndexRange range_00;
  IndexRange range_01;
  IndexRange range_02;
  IndexRange range_03;
  ulong uVar1;
  long lVar2;
  size_type sVar3;
  VectorDynSize *in_RCX;
  LinkWrenches *in_RDX;
  VectorDynSize *in_RSI;
  Matrix<double,_6,_1,_0,_6,_1> *in_RDI;
  VectorDynSize *in_R8;
  LinkWrenches *in_R9;
  BerdyHelper *in_stack_00000010;
  IndexRange sensorRange_4;
  LinkIndex childLink;
  IndexRange sensorRange_3;
  size_t i;
  IndexRange sensorRange_2;
  LinkIndex idx_2;
  IndexRange sensorRange_1;
  DOFIndex idx_1;
  IndexRange sensorRange;
  DOFIndex idx;
  IndexRange ran;
  bool ok;
  bool ret;
  Model *in_stack_fffffffffffffd48;
  BerdySensorTypes sensorType;
  BerdyHelper *in_stack_fffffffffffffd50;
  undefined4 in_stack_fffffffffffffd58;
  undefined4 uVar4;
  BerdySensorTypes in_stack_fffffffffffffd5c;
  BerdySensorTypes sensorType_00;
  BerdyHelper *in_stack_fffffffffffffd60;
  VectorDynSize *in_stack_fffffffffffffd68;
  Wrench *pWVar5;
  undefined7 in_stack_fffffffffffffdb0;
  byte bVar6;
  ptrdiff_t in_stack_fffffffffffffdb8;
  ptrdiff_t in_stack_fffffffffffffdc0;
  SpatialForceVector *in_stack_fffffffffffffdd8;
  VectorDynSize *in_stack_fffffffffffffde0;
  IndexRange in_stack_fffffffffffffde8;
  size_type local_1c8;
  Wrench local_1b0;
  Transform local_150 [104];
  ptrdiff_t local_e8;
  ptrdiff_t pStack_e0;
  IndexRange local_d8;
  size_type local_c8;
  ptrdiff_t local_c0;
  ptrdiff_t local_b8;
  IndexRange local_b0;
  ulong local_a0;
  ptrdiff_t local_98;
  ptrdiff_t local_90;
  IndexRange local_88;
  ulong local_78;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  byte local_32;
  byte local_31;
  LinkWrenches *local_30;
  VectorDynSize *local_28;
  VectorDynSize *local_20;
  LinkWrenches *local_18;
  
  local_31 = 1;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_32 = iDynTree::SensorsMeasurements::toVector(in_RSI);
  local_32 = local_32 & 1;
  bVar6 = 0;
  if ((local_31 & 1) != 0) {
    bVar6 = local_32;
  }
  local_48 = 0;
  local_31 = bVar6;
  local_50 = iDynTree::VectorDynSize::size();
  local_58 = local_48;
  local_40 = local_50;
  toEigen(in_stack_fffffffffffffd68);
  range_01.size = in_stack_fffffffffffffdc0;
  range_01.offset = in_stack_fffffffffffffdb8;
  setSubVector<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::Stride<0,0>>>
            ((VectorDynSize *)CONCAT17(bVar6,in_stack_fffffffffffffdb0),range_01,
             (Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI);
  if (((ulong)in_RDI[9].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[0] & 0x10000000000) != 0) {
    for (local_78 = 0; uVar1 = local_78, lVar2 = iDynTree::Model::getNrOfDOFs(), (long)uVar1 < lVar2
        ; local_78 = local_78 + 1) {
      local_88 = getRangeDOFSensorVariable
                           (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                            (DOFIndex)in_stack_fffffffffffffd50);
      local_98 = local_88.offset;
      local_90 = local_88.size;
      iDynTree::VectorDynSize::operator()(local_28,local_78);
      range.offset._4_4_ = in_stack_fffffffffffffd5c;
      range.offset._0_4_ = in_stack_fffffffffffffd58;
      range.size = (ptrdiff_t)in_stack_fffffffffffffd60;
      setSubVector((VectorDynSize *)in_stack_fffffffffffffd50,range,
                   (double)in_stack_fffffffffffffd48);
    }
  }
  if (((ulong)in_RDI[9].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[0] & 0x1000000000000) != 0) {
    for (local_a0 = 0; uVar1 = local_a0, lVar2 = iDynTree::Model::getNrOfDOFs(), (long)uVar1 < lVar2
        ; local_a0 = local_a0 + 1) {
      local_b0 = getRangeDOFSensorVariable
                           (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                            (DOFIndex)in_stack_fffffffffffffd50);
      local_c0 = local_b0.offset;
      local_b8 = local_b0.size;
      iDynTree::VectorDynSize::operator()(local_20,local_a0);
      range_00.offset._4_4_ = in_stack_fffffffffffffd5c;
      range_00.offset._0_4_ = in_stack_fffffffffffffd58;
      range_00.size = (ptrdiff_t)in_stack_fffffffffffffd60;
      setSubVector((VectorDynSize *)in_stack_fffffffffffffd50,range_00,
                   (double)in_stack_fffffffffffffd48);
    }
  }
  if (((ulong)in_RDI[9].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array[0] & 0x100000000000000) != 0) {
    for (local_c8 = 0; sVar3 = local_c8, lVar2 = iDynTree::Model::getNrOfLinks(),
        (long)sVar3 < lVar2; local_c8 = local_c8 + 1) {
      if (*(int *)in_RDI[9].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                  m_data.array == 0) {
        iDynTree::Traversal::getBaseLink();
        sVar3 = iDynTree::Link::getIndex();
        if ((sVar3 != local_c8) ||
           (((ulong)in_RDI[9].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage
                    .m_data.array[1] & 1) != 0)) goto LAB_00527797;
      }
      else {
LAB_00527797:
        local_d8 = getRangeLinkSensorVariable
                             (in_stack_fffffffffffffd60,in_stack_fffffffffffffd5c,
                              (LinkIndex)in_stack_fffffffffffffd50);
        local_e8 = local_d8.offset;
        pStack_e0 = local_d8.size;
        in_stack_fffffffffffffd60 = in_stack_00000010;
        std::vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_>::operator[]
                  ((vector<iDynTree::Transform,_std::allocator<iDynTree::Transform>_> *)
                   (in_RDI[0x12].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                    m_storage.m_data.array + 5),local_c8);
        pWVar5 = &local_1b0;
        iDynTree::Transform::inverse();
        iDynTree::LinkWrenches::operator()(local_18,local_c8);
        iDynTree::Transform::operator*(local_150,pWVar5);
        toEigen(in_stack_fffffffffffffdd8);
        range_02.size = in_stack_fffffffffffffdc0;
        range_02.offset = in_stack_fffffffffffffdb8;
        setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
                  ((VectorDynSize *)CONCAT17(bVar6,in_stack_fffffffffffffdb0),range_02,in_RDI);
        Wrench::~Wrench((Wrench *)0x52787d);
      }
    }
  }
  local_1c8 = 0;
  while( true ) {
    sensorType = (BerdySensorTypes)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    uVar4 = (undefined4)local_1c8;
    sensorType_00 = (BerdySensorTypes)(local_1c8 >> 0x20);
    sVar3 = std::vector<long,_std::allocator<long>_>::size
                      ((vector<long,_std::allocator<long>_> *)
                       (in_RDI[0x10].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.
                        m_storage.m_data.array + 1));
    if (sVar3 <= CONCAT44(sensorType_00,uVar4)) break;
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)
               (in_RDI[0x10].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array + 1),local_1c8);
    getRangeJointSensorVariable
              (in_stack_fffffffffffffd60,sensorType_00,(JointIndex)in_stack_fffffffffffffd50);
    in_stack_fffffffffffffd48 =
         (Model *)(in_RDI[6].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                   m_data.array + 2);
    std::vector<long,_std::allocator<long>_>::operator[]
              ((vector<long,_std::allocator<long>_> *)
               (in_RDI[0x10].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
                m_data.array + 1),local_1c8);
    lVar2 = iDynTree::Traversal::getChildLinkIndexFromJointIndex
                      (in_stack_fffffffffffffd48,(long)in_RDI);
    in_stack_fffffffffffffd50 = in_stack_00000010;
    iDynTree::LinkWrenches::operator()(local_30,lVar2);
    toEigen(in_stack_fffffffffffffdd8);
    range_03.size = in_stack_fffffffffffffdc0;
    range_03.offset = in_stack_fffffffffffffdb8;
    setSubVector<Eigen::Matrix<double,6,1,0,6,1>>
              ((VectorDynSize *)CONCAT17(bVar6,in_stack_fffffffffffffdb0),range_03,in_RDI);
    local_1c8 = local_1c8 + 1;
  }
  if (*(int *)in_RDI[9].super_PlainObjectBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>.m_storage.
              m_data.array == 2) {
    getRangeRCMSensorVariable(in_stack_fffffffffffffd50,sensorType);
    setSubVector(in_stack_fffffffffffffde0,in_stack_fffffffffffffde8,in_stack_fffffffffffffdd8);
  }
  return (bool)(local_31 & 1);
}

Assistant:

bool BerdyHelper::serializeSensorVariables(SensorsMeasurements& sensMeas,
                                           LinkNetExternalWrenches& netExtWrenches,
                                           JointDOFsDoubleArray& jointTorques,
                                           JointDOFsDoubleArray& jointAccs,
                                           LinkInternalWrenches& linkJointWrenches,
                                           SpatialForceVector& rcm,
                                           VectorDynSize& y)
{
    bool ret=true;
    assert(y.size() == this->getNrOfSensorsMeasurements());

    bool ok = sensMeas.toVector(realSensorMeas);
    ret = ret && ok;

    // The first part of the sensor vector is exactly the serialization of the sensMeas object
    IndexRange ran;
    ran.offset = 0;
    ran.size = realSensorMeas.size();
    setSubVector(y,ran,toEigen(realSensorMeas));

    // Then we need to follow the serialization used in computeBerdySensorMatrices

     ////////////////////////////////////////////////////////////////////////
    ///// JOINT ACCELERATIONS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointAccelerationsAsSensors )
    {
        for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_ACCELERATION_SENSOR,idx);

            setSubVector(y,sensorRange,jointAccs(idx));
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT TORQUES
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllJointTorquesAsSensors )
    {
        for(DOFIndex idx = 0; idx < static_cast<DOFIndex>(m_model.getNrOfDOFs()); idx++)
        {
            IndexRange sensorRange = this->getRangeDOFSensorVariable(DOF_TORQUE_SENSOR,idx);

            setSubVector(y,sensorRange,jointTorques(idx));
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// NET EXTERNAL WRENCHES ACTING ON LINKS
    ////////////////////////////////////////////////////////////////////////
    if( m_options.includeAllNetExternalWrenchesAsSensors )
    {
        for(LinkIndex idx = 0; idx < static_cast<LinkIndex>(m_model.getNrOfLinks()); idx++)
        {
            if( !(m_options.berdyVariant == ORIGINAL_BERDY_FIXED_BASE &&
                  m_dynamicsTraversal.getBaseLink()->getIndex() == idx) ||
                 m_options.includeFixedBaseExternalWrench  )
            {
                IndexRange sensorRange = this->getRangeLinkSensorVariable(NET_EXT_WRENCH_SENSOR,idx);

                setSubVector(y,sensorRange,toEigen(m_link_H_externalWrenchMeasurementFrame[idx].inverse()*netExtWrenches(idx)));
            }
        }
    }

    ////////////////////////////////////////////////////////////////////////
    ///// JOINT WRENCHES
    ////////////////////////////////////////////////////////////////////////
    for(size_t i = 0; i < this->berdySensorsInfo.wrenchSensors.size(); i++)
    {
        IndexRange sensorRange = this->getRangeJointSensorVariable(JOINT_WRENCH_SENSOR,berdySensorsInfo.wrenchSensors[i]);

        LinkIndex childLink = m_dynamicsTraversal.getChildLinkIndexFromJointIndex(m_model,berdySensorsInfo.wrenchSensors[i]);
        setSubVector(y,sensorRange,toEigen(linkJointWrenches(childLink)));
    }

    ////////////////////////////////////////////////////////////////////////
    ///// Rate of Change of Momentum (RCM)
    ////////////////////////////////////////////////////////////////////////
    /// This method serializeSensorVariables is used in Testing for the Berdy estimator helper class
    if (m_options.berdyVariant==BERDY_FLOATING_BASE_NON_COLLOCATED_EXT_WRENCHES)
    {
        IndexRange sensorRange = this->getRangeRCMSensorVariable(RCM_SENSOR);

        setSubVector(y, sensorRange, rcm);
    }

    return ret;
}